

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree_node.cpp
# Opt level: O3

void __thiscall b_tree_node::_split_child(b_tree_node *this,int i,int64_t ofs)

{
  ushort uVar1;
  int64_t *piVar2;
  ushort *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  b_tree_node new_node;
  b_tree_node original_node;
  b_tree_node bStack_e8;
  b_tree_node local_80;
  
  uVar5 = (ulong)(uint)i;
  b_tree_node(&local_80,this->_p,ofs);
  b_tree_node(&bStack_e8,this->_p,*local_80._min_degree_field,*local_80._leaf_field != 0);
  puVar3 = this->_min_degree_field;
  *bStack_e8._num_keys_field = *puVar3 - 1;
  uVar4 = (ulong)*puVar3;
  if (1 < *puVar3) {
    lVar6 = 0;
    do {
      bStack_e8._keys_field[lVar6] = local_80._keys_field[lVar6 + uVar4];
      bStack_e8._valid_keys_field[lVar6] = local_80._valid_keys_field[lVar6 + uVar4];
      puVar3 = this->_min_degree_field;
      uVar4 = (ulong)*puVar3;
      bStack_e8._vals_field[lVar6] = local_80._vals_field[uVar4 + lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)(uVar4 - 1));
  }
  if ((*local_80._leaf_field == 0) && ((int)uVar4 != 0)) {
    uVar7 = 0;
    do {
      bStack_e8._child_ofs_field[uVar7] =
           *(int64_t *)
            ((long)local_80._child_ofs_field + uVar7 * 8 + (ulong)(uint)((int)uVar4 << 3));
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  *local_80._num_keys_field = (short)uVar4 - 1;
  piVar2 = this->_child_ofs_field;
  uVar1 = *this->_num_keys_field;
  uVar4 = (ulong)uVar1;
  if (i < (int)(uint)uVar1) {
    uVar5 = (ulong)i;
    uVar7 = uVar4;
    do {
      piVar2[uVar7 + 1] = piVar2[uVar7];
      uVar7 = uVar7 - 1;
    } while ((long)uVar5 < (long)uVar7);
    piVar2[uVar5 + 1] = bStack_e8._ofs_field;
    if (i < (int)(uint)uVar1) {
      do {
        this->_keys_field[uVar4] = this->_keys_field[uVar4 - 1];
        this->_valid_keys_field[uVar4] = this->_valid_keys_field[uVar4 - 1];
        this->_vals_field[uVar4] = this->_vals_field[uVar4 - 1];
        uVar4 = uVar4 - 1;
      } while ((long)uVar5 < (long)uVar4);
      puVar3 = this->_min_degree_field;
    }
  }
  else {
    piVar2[uVar5 + 1] = bStack_e8._ofs_field;
  }
  uVar1 = *puVar3;
  this->_keys_field[uVar5] = local_80._keys_field[(ulong)uVar1 - 1];
  this->_valid_keys_field[uVar5] = local_80._valid_keys_field[(ulong)uVar1 - 1];
  this->_vals_field[uVar5] = local_80._vals_field[(ulong)*this->_min_degree_field - 1];
  *this->_num_keys_field = *this->_num_keys_field + 1;
  r_memory_map::~r_memory_map(&bStack_e8._mm);
  r_memory_map::~r_memory_map(&local_80._mm);
  return;
}

Assistant:

void b_tree_node::_split_child(int i, int64_t ofs)
{
    b_tree_node original_node(_p, ofs);

    // Create a new node which is going to store (t-1) keys
    // of original_node
    b_tree_node new_node(_p, original_node._min_degree(), original_node._leaf());
    new_node._set_num_keys(_min_degree() - 1);
 
    // Copy the last (min_degree-1) keys of original_node to new_node
    for (int j = 0; j < _min_degree()-1; j++)
    {
        new_node._keys_field[j] = original_node._keys_field[j+_min_degree()];
        new_node._valid_keys_field[j] = original_node._valid_keys_field[j+_min_degree()];
        new_node._vals_field[j] = original_node._vals_field[j+_min_degree()];
    }
 
    // Copy the last min_degree children of original_node to new_node
    if (original_node._leaf() == false)
    {
        for (int j = 0; j < _min_degree(); j++)
            new_node._child_ofs_field[j] = original_node._child_ofs_field[j+_min_degree()];
    }
 
    // Reduce the number of keys in original_node
    original_node._set_num_keys(_min_degree() - 1);
 
    // Since this node is going to have a new child,
    // create space of new child
    for (int j = _num_keys(); j >= i+1; j--)
        _child_ofs_field[j+1] = _child_ofs_field[j];
 
    // Link the new child to this node
    _child_ofs_field[i+1] = new_node._ofs();
 
    // A key of original_node will move to this node. Find the location of
    // new key and move all greater keys one space ahead
    for (int j = _num_keys()-1; j >= i; j--)
    {
        _keys_field[j+1] = _keys_field[j];
        _valid_keys_field[j+1] = _valid_keys_field[j];
        _vals_field[j+1] = _vals_field[j];
    }
 
    // Copy the middle key of original_node to this node
    _keys_field[i] = original_node._keys_field[_min_degree()-1];
    _valid_keys_field[i] = original_node._valid_keys_field[_min_degree()-1];
    _vals_field[i] = original_node._vals_field[_min_degree()-1];
 
    // Increment count of keys in this node
    _set_num_keys(_num_keys() + 1);
}